

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_core.c
# Opt level: O0

int rxa2_fill_memory_blocks(argon2_instance_t *instance)

{
  long in_RDI;
  argon2_instance_t *unaff_retaddr;
  undefined4 local_4;
  
  if ((in_RDI == 0) || (*(int *)(in_RDI + 0x1c) == 0)) {
    local_4 = -0x19;
  }
  else {
    local_4 = fill_memory_blocks_st(unaff_retaddr);
  }
  return local_4;
}

Assistant:

int rxa2_fill_memory_blocks(argon2_instance_t *instance) {
	if (instance == NULL || instance->lanes == 0) {
		return ARGON2_INCORRECT_PARAMETER;
	}
	return fill_memory_blocks_st(instance);
}